

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::lsd_peer_alert::~lsd_peer_alert(lsd_peer_alert *this)

{
  torrent_alert::~torrent_alert((torrent_alert *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

struct TORRENT_EXPORT lsd_peer_alert final : peer_alert
	{
		// internal
		TORRENT_UNEXPORT lsd_peer_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& i);

		TORRENT_DEFINE_ALERT(lsd_peer_alert, 60)

		static inline constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;
	}